

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O2

void __thiscall
pow_tests::CheckProofOfWork_test_zero_target::test_method(CheckProofOfWork_test_zero_target *this)

{
  long lVar1;
  uint256 hash;
  bool bVar2;
  uint32_t nBits;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  assertion_result local_230;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [24];
  __pthread_internal_list *p_Stack_1e0;
  arith_uint256 hash_arith;
  __native_type local_1b8;
  Params consensus;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&local_1b8.__data,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  Consensus::Params::Params(&consensus,(Params *)local_1b8.__align);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             &local_1b8.__data);
  base_uint<256U>::base_uint(&hash_arith.super_base_uint<256U>,0);
  nBits = arith_uint256::GetCompact((arith_uint256 *)&hash_arith.super_base_uint<256U>,false);
  ArithToUint256((uint256 *)local_1f8,&hash_arith);
  local_1b8._8_8_ = CONCAT71(local_1f8._9_7_,local_1f8[8]);
  local_1b8._16_8_ = local_1f8._16_8_;
  local_1b8.__data.__list.__prev = p_Stack_1e0;
  local_1b8.__align = local_1f8._0_8_;
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x86;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  hash.super_base_blob<256U>.m_data._M_elems[8] = local_1b8.__size[8];
  hash.super_base_blob<256U>.m_data._M_elems[9] = local_1b8.__size[9];
  hash.super_base_blob<256U>.m_data._M_elems[10] = local_1b8.__size[10];
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = local_1b8.__size[0xb];
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = local_1b8.__size[0xc];
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = local_1b8.__size[0xd];
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = local_1b8.__size[0xe];
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = local_1b8.__size[0xf];
  hash.super_base_blob<256U>.m_data._M_elems[0] = local_1b8.__size[0];
  hash.super_base_blob<256U>.m_data._M_elems[1] = local_1b8.__size[1];
  hash.super_base_blob<256U>.m_data._M_elems[2] = local_1b8.__size[2];
  hash.super_base_blob<256U>.m_data._M_elems[3] = local_1b8.__size[3];
  hash.super_base_blob<256U>.m_data._M_elems[4] = local_1b8.__size[4];
  hash.super_base_blob<256U>.m_data._M_elems[5] = local_1b8.__size[5];
  hash.super_base_blob<256U>.m_data._M_elems[6] = local_1b8.__size[6];
  hash.super_base_blob<256U>.m_data._M_elems[7] = local_1b8.__size[7];
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = local_1b8.__size[0x10];
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = local_1b8.__size[0x11];
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = local_1b8.__size[0x12];
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = local_1b8.__size[0x13];
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = local_1b8.__size[0x14];
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = local_1b8.__size[0x15];
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = local_1b8.__size[0x16];
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = local_1b8.__size[0x17];
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = local_1b8.__data.__list.__prev;
  bVar2 = CheckProofOfWork(hash,nBits,&consensus);
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  p_Stack_1e0 = (__pthread_internal_list *)&local_240;
  local_240 = "!CheckProofOfWork(hash, nBits, consensus)";
  local_238 = "";
  local_1f8[8] = false;
  local_1f8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1f8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_248 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_1f8,1,0,WARN,(check_type)local_1b8._8_8_,
             (size_t)&local_250,0x86);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  Consensus::Params::~Params(&consensus);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckProofOfWork_test_zero_target)
{
    const auto consensus = CreateChainParams(*m_node.args, ChainType::MAIN)->GetConsensus();
    uint256 hash;
    unsigned int nBits;
    arith_uint256 hash_arith{0};
    nBits = hash_arith.GetCompact();
    hash = ArithToUint256(hash_arith);
    BOOST_CHECK(!CheckProofOfWork(hash, nBits, consensus));
}